

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_lzma_bit(uchar *compressed,size_t compressed_size,uint16_t *prob,size_t *poffset,
                uint32_t *prange,uint32_t *pcode)

{
  ushort uVar1;
  uint uVar2;
  short sVar3;
  uint uVar4;
  
  elf_lzma_range_normalize(compressed,compressed_size,poffset,prange,pcode);
  uVar1 = *prob;
  uVar4 = (*prange >> 0xb) * (uint)uVar1;
  uVar2 = *pcode;
  if (uVar4 <= uVar2) {
    *prange = *prange - uVar4;
    *pcode = *pcode - uVar4;
    sVar3 = -(uVar1 >> 5);
  }
  else {
    *prange = uVar4;
    sVar3 = (short)(0x800 - uVar1 >> 5);
  }
  *prob = sVar3 + uVar1;
  return (uint)(uVar4 <= uVar2);
}

Assistant:

static int
elf_lzma_bit (const unsigned char *compressed, size_t compressed_size,
	      uint16_t *prob, size_t *poffset, uint32_t *prange,
	      uint32_t *pcode)
{
  uint32_t bound;

  elf_lzma_range_normalize (compressed, compressed_size, poffset,
			    prange, pcode);
  bound = (*prange >> 11) * (uint32_t) *prob;
  if (*pcode < bound)
    {
      *prange = bound;
      *prob += ((1U << 11) - *prob) >> 5;
      return 0;
    }
  else
    {
      *prange -= bound;
      *pcode -= bound;
      *prob -= *prob >> 5;
      return 1;
    }
}